

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_subset_seq_parameter_set_rbsp(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *sps_svc_ext;
  uint32_t uVar1;
  int iVar2;
  
  read_seq_parameter_set_rbsp(sps_subset->sps,b);
  iVar2 = sps_subset->sps->profile_idc;
  if ((iVar2 == 0x56) || (iVar2 == 0x53)) {
    read_seq_parameter_set_svc_extension(sps_subset,b);
    sps_svc_ext = (sps_subset->field_1).sps_svc_ext;
    uVar1 = bs_read_u1(b);
    sps_svc_ext->svc_vui_parameters_present_flag = SUB41(uVar1,0);
    if (uVar1 != 0) {
      read_svc_vui_parameters_extension(sps_svc_ext,b);
    }
  }
  uVar1 = bs_read_u1(b);
  sps_subset->additional_extension2_flag = SUB41(uVar1,0);
  if (uVar1 != 0) {
    while( true ) {
      iVar2 = more_rbsp_data(b);
      if (iVar2 == 0) break;
      uVar1 = bs_read_u1(b);
      sps_subset->additional_extension2_flag = SUB41(uVar1,0);
    }
  }
  return;
}

Assistant:

void read_subset_seq_parameter_set_rbsp(sps_subset_t* sps_subset, bs_t* b)
{
    read_seq_parameter_set_rbsp(sps_subset->sps, b);
    
    switch( sps_subset->sps->profile_idc )
    {
        case 83:
        case 86:
            read_seq_parameter_set_svc_extension(sps_subset, b); /* specified in Annex G */
            
            sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
            sps_svc_ext->svc_vui_parameters_present_flag = bs_read_u1(b);
            
            if( sps_svc_ext->svc_vui_parameters_present_flag )
            {
                read_svc_vui_parameters_extension(sps_svc_ext,b); /* specified in Annex G */
            }
            break;
        default:
            break;
    }
    sps_subset->additional_extension2_flag = bs_read_u1(b);
    if( sps_subset->additional_extension2_flag )
    {
        while( more_rbsp_data( b ) )
        {
            sps_subset->additional_extension2_flag = bs_read_u1(b);
        }
    }
    
}